

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hiredis.c
# Opt level: O2

int redisvFormatCommand(char **target,char *format,__va_list_tag *ap)

{
  char *pcVar1;
  uint uVar2;
  sds pcVar3;
  bool bVar4;
  bool bVar5;
  uint32_t uVar6;
  int iVar7;
  int iVar8;
  sds pcVar9;
  sds pcVar10;
  undefined8 *puVar11;
  size_t *psVar12;
  ushort **ppuVar13;
  size_t len;
  void *pvVar14;
  size_t sVar15;
  char *pcVar16;
  ulong uVar17;
  char cVar18;
  uint64_t v;
  long lVar19;
  int iVar20;
  void *__ptr;
  uint uVar21;
  char *pcVar22;
  int local_94;
  va_list _cpy;
  char _format [16];
  
  if ((target == (char **)0x0) || (pcVar9 = sdsempty(), pcVar9 == (sds)0x0)) {
    return -1;
  }
  local_94 = -1;
  bVar4 = false;
  __ptr = (void *)0x0;
  uVar21 = 0;
  iVar20 = 0;
LAB_00104d0d:
  cVar18 = *format;
  pcVar10 = pcVar9;
  if (cVar18 != ' ') {
    if (cVar18 == '%') {
      cVar18 = format[1];
      if (cVar18 == '\0') goto LAB_00104d23;
      if (cVar18 != '%') {
        if (cVar18 == 'b') {
          uVar2 = ap->gp_offset;
          uVar17 = (ulong)uVar2;
          if (uVar17 < 0x29) {
            ap->gp_offset = (uint)(uVar17 + 8);
            pvVar14 = *(void **)((long)ap->reg_save_area + uVar17);
            if (0x20 < uVar2) goto LAB_00104f5d;
            psVar12 = (size_t *)(uVar17 + 8 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 0x10;
          }
          else {
            puVar11 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar11 + 1;
            pvVar14 = (void *)*puVar11;
LAB_00104f5d:
            psVar12 = (size_t *)ap->overflow_arg_area;
            ap->overflow_arg_area = psVar12 + 1;
          }
          if (*psVar12 != 0) {
            pcVar10 = sdscatlen(pcVar9,pvVar14,*psVar12);
          }
          goto LAB_001050a1;
        }
        if (cVar18 == 's') {
          uVar2 = ap->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            puVar11 = (undefined8 *)((ulong)uVar2 + (long)ap->reg_save_area);
            ap->gp_offset = uVar2 + 8;
          }
          else {
            puVar11 = (undefined8 *)ap->overflow_arg_area;
            ap->overflow_arg_area = puVar11 + 1;
          }
          pcVar16 = (char *)*puVar11;
          len = strlen(pcVar16);
          if (len != 0) {
            pcVar10 = sdscatlen(pcVar9,pcVar16,len);
          }
          goto LAB_001050a1;
        }
        pcVar16 = format + 2;
        pcVar1 = format;
        while ((pcVar22 = pcVar1 + 1, cVar18 != '\0' &&
               (pvVar14 = memchr("#0-+ ",(int)cVar18,6), pvVar14 != (void *)0x0))) {
          cVar18 = pcVar1[2];
          pcVar16 = pcVar16 + 1;
          pcVar1 = pcVar22;
        }
        while (cVar18 != '\0') {
          ppuVar13 = __ctype_b_loc();
          if ((*(byte *)((long)*ppuVar13 + (long)cVar18 * 2 + 1) & 8) == 0) {
            if (cVar18 == '.') goto LAB_00104eb4;
            break;
          }
          pcVar1 = pcVar22 + 1;
          pcVar22 = pcVar22 + 1;
          pcVar16 = pcVar16 + 1;
          cVar18 = *pcVar1;
        }
        goto LAB_00104ecc;
      }
      pcVar10 = sdscat(pcVar9,"%");
      goto LAB_001050a1;
    }
    if (cVar18 != '\0') {
LAB_00104d23:
      pcVar10 = sdscatlen(pcVar9,format,1);
      bVar4 = true;
      if (pcVar10 != (sds)0x0) goto LAB_001050b0;
      goto LAB_00105242;
    }
    v = (uint64_t)(int)uVar21;
    if (bVar4) {
      pvVar14 = realloc(__ptr,v * 8 + 8);
      if (pvVar14 == (void *)0x0) goto LAB_00105242;
      uVar21 = uVar21 + 1;
      *(sds *)((long)pvVar14 + v * 8) = pcVar9;
      v = v + 1;
      sVar15 = sdslen(pcVar9);
      sVar15 = bulklen(sVar15);
      iVar20 = iVar20 + (int)sVar15;
      __ptr = pvVar14;
    }
    else {
      sdsfree(pcVar9);
    }
    uVar6 = countDigits(v);
    pcVar16 = (char *)malloc((long)(int)(uVar6 + iVar20 + 4));
    pcVar9 = (sds)0x0;
    if (pcVar16 != (char *)0x0) {
      iVar20 = uVar6 + iVar20 + 3;
      iVar7 = sprintf(pcVar16,"*%d\r\n",(ulong)uVar21);
      pcVar10 = (sds)(ulong)uVar21;
      if ((int)uVar21 < 1) {
        pcVar10 = pcVar9;
      }
      for (pcVar9 = (sds)0x0; pcVar10 != pcVar9; pcVar9 = pcVar9 + 1) {
        sVar15 = sdslen(*(sds *)((long)__ptr + (long)pcVar9 * 8));
        iVar8 = sprintf(pcVar16 + iVar7,"$%zu\r\n",sVar15);
        iVar8 = iVar8 + iVar7;
        pcVar3 = *(sds *)((long)__ptr + (long)pcVar9 * 8);
        sVar15 = sdslen(pcVar3);
        memcpy(pcVar16 + iVar8,pcVar3,sVar15);
        pcVar3 = *(sds *)((long)__ptr + (long)pcVar9 * 8);
        sVar15 = sdslen(pcVar3);
        sdsfree(pcVar3);
        (pcVar16 + ((int)sVar15 + iVar8))[0] = '\r';
        (pcVar16 + ((int)sVar15 + iVar8))[1] = '\n';
        iVar7 = iVar8 + (int)sVar15 + 2;
      }
      if (iVar7 == iVar20) {
        pcVar16[iVar20] = '\0';
        free(__ptr);
        *target = pcVar16;
        return iVar20;
      }
      __assert_fail("pos == totlen",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/DGuco[P]exhiredis/hiredis/hiredis.c"
                    ,0x1e5,"int redisvFormatCommand(char **, const char *, struct __va_list_tag *)")
      ;
    }
LAB_00105242:
    pvVar14 = __ptr;
    if (__ptr != (void *)0x0) {
LAB_00105247:
      lVar19 = (long)(int)uVar21;
      while (lVar19 = lVar19 + -1, lVar19 != -1) {
        sdsfree(*(sds *)((long)pvVar14 + lVar19 * 8));
      }
      free(pvVar14);
    }
    sdsfree(pcVar9);
    return local_94;
  }
  bVar5 = !bVar4;
  bVar4 = false;
  if (bVar5) goto LAB_001050b0;
  lVar19 = (long)(int)uVar21;
  pvVar14 = realloc(__ptr,lVar19 * 8 + 8);
  if (pvVar14 == (void *)0x0) goto LAB_00105242;
  uVar21 = uVar21 + 1;
  *(sds *)((long)pvVar14 + lVar19 * 8) = pcVar9;
  sVar15 = sdslen(pcVar9);
  sVar15 = bulklen(sVar15);
  pcVar10 = sdsempty();
  if (pcVar10 == (sds)0x0) {
    pcVar9 = (sds)0x0;
    goto LAB_00105247;
  }
  iVar20 = iVar20 + (int)sVar15;
  __ptr = pvVar14;
  goto LAB_001050b0;
  while (pcVar16 = pcVar22 + 1, (*(byte *)((long)*ppuVar13 + (long)*pcVar22 * 2 + 1) & 8) != 0) {
LAB_00104eb4:
    pcVar22 = pcVar16;
    if ((long)*pcVar22 == 0) break;
  }
LAB_00104ecc:
  _cpy[0].reg_save_area = ap->reg_save_area;
  _cpy[0].gp_offset = ap->gp_offset;
  _cpy[0].fp_offset = ap->fp_offset;
  _cpy[0].overflow_arg_area = ap->overflow_arg_area;
  cVar18 = *pcVar22;
  pvVar14 = memchr("diouxX",(int)cVar18,7);
  if (pvVar14 == (void *)0x0) {
    pvVar14 = memchr("eEfFgGaA",(int)cVar18,9);
    if (pvVar14 == (void *)0x0) {
      if (cVar18 == 'l') {
        cVar18 = pcVar22[1];
        if (cVar18 == 'l') goto LAB_00104fe5;
LAB_0010501a:
        if ((cVar18 == '\0') || (pvVar14 = memchr("diouxX",(int)cVar18,7), pvVar14 == (void *)0x0))
        goto LAB_00105236;
        pcVar22 = pcVar22 + 1;
      }
      else {
        if (cVar18 != 'h') goto LAB_00105236;
        cVar18 = pcVar22[1];
        if (cVar18 != 'h') goto LAB_0010501a;
LAB_00104fe5:
        if ((pcVar22[2] == '\0') ||
           (pvVar14 = memchr("diouxX",(int)pcVar22[2],7), pvVar14 == (void *)0x0)) {
LAB_00105236:
          local_94 = -2;
          goto LAB_00105242;
        }
        pcVar22 = pcVar22 + 2;
      }
      uVar2 = ap->gp_offset;
      goto joined_r0x0010504a;
    }
    if (0xa0 < ap->fp_offset) goto LAB_00105050;
    ap->fp_offset = ap->fp_offset + 0x10;
  }
  else {
    uVar2 = ap->gp_offset;
joined_r0x0010504a:
    if (uVar2 < 0x29) {
      ap->gp_offset = uVar2 + 8;
    }
    else {
LAB_00105050:
      ap->overflow_arg_area = (void *)((long)ap->overflow_arg_area + 8);
    }
  }
  pcVar16 = pcVar22 + (1 - (long)format);
  if (pcVar16 < (char *)0xe) {
    memcpy(_format,format,(size_t)pcVar16);
    _format[(long)pcVar16] = '\0';
    pcVar10 = sdscatvprintf(pcVar9,_format,_cpy);
    format = pcVar22 + -1;
  }
LAB_001050a1:
  if (pcVar10 == (sds)0x0) goto LAB_00105242;
  format = format + 1;
  bVar4 = true;
LAB_001050b0:
  format = format + 1;
  pcVar9 = pcVar10;
  goto LAB_00104d0d;
}

Assistant:

int redisvFormatCommand(char **target, const char *format, va_list ap) {
    const char *c = format;
    char *cmd = NULL; /* final command */
    int pos; /* position in final command */
    sds curarg, newarg; /* current argument */
    int touched = 0; /* was the current argument touched? */
    char **curargv = NULL, **newargv = NULL;
    int argc = 0;
    int totlen = 0;
    int error_type = 0; /* 0 = no error; -1 = memory error; -2 = format error */
    int j;

    /* Abort if there is not target to set */
    if (target == NULL)
        return -1;

    /* Build the command string accordingly to protocol */
    curarg = sdsempty();
    if (curarg == NULL)
        return -1;

    while(*c != '\0') {
        if (*c != '%' || c[1] == '\0') {
            if (*c == ' ') {
                if (touched) {
                    newargv = realloc(curargv,sizeof(char*)*(argc+1));
                    if (newargv == NULL) goto memory_err;
                    curargv = newargv;
                    curargv[argc++] = curarg;
                    totlen += bulklen(sdslen(curarg));

                    /* curarg is put in argv so it can be overwritten. */
                    curarg = sdsempty();
                    if (curarg == NULL) goto memory_err;
                    touched = 0;
                }
            } else {
                newarg = sdscatlen(curarg,c,1);
                if (newarg == NULL) goto memory_err;
                curarg = newarg;
                touched = 1;
            }
        } else {
            char *arg;
            size_t size;

            /* Set newarg so it can be checked even if it is not touched. */
            newarg = curarg;

            switch(c[1]) {
            case 's':
                arg = va_arg(ap,char*);
                size = strlen(arg);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case 'b':
                arg = va_arg(ap,char*);
                size = va_arg(ap,size_t);
                if (size > 0)
                    newarg = sdscatlen(curarg,arg,size);
                break;
            case '%':
                newarg = sdscat(curarg,"%");
                break;
            default:
                /* Try to detect printf format */
                {
                    static const char intfmts[] = "diouxX";
                    static const char flags[] = "#0-+ ";
                    char _format[16];
                    const char *_p = c+1;
                    size_t _l = 0;
                    va_list _cpy;

                    /* Flags */
                    while (*_p != '\0' && strchr(flags,*_p) != NULL) _p++;

                    /* Field width */
                    while (*_p != '\0' && isdigit(*_p)) _p++;

                    /* Precision */
                    if (*_p == '.') {
                        _p++;
                        while (*_p != '\0' && isdigit(*_p)) _p++;
                    }

                    /* Copy va_list before consuming with va_arg */
                    va_copy(_cpy,ap);

                    /* Integer conversion (without modifiers) */
                    if (strchr(intfmts,*_p) != NULL) {
                        va_arg(ap,int);
                        goto fmt_valid;
                    }

                    /* Double conversion (without modifiers) */
                    if (strchr("eEfFgGaA",*_p) != NULL) {
                        va_arg(ap,double);
                        goto fmt_valid;
                    }

                    /* Size: char */
                    if (_p[0] == 'h' && _p[1] == 'h') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* char gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: short */
                    if (_p[0] == 'h') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,int); /* short gets promoted to int */
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long long */
                    if (_p[0] == 'l' && _p[1] == 'l') {
                        _p += 2;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                    /* Size: long */
                    if (_p[0] == 'l') {
                        _p += 1;
                        if (*_p != '\0' && strchr(intfmts,*_p) != NULL) {
                            va_arg(ap,long);
                            goto fmt_valid;
                        }
                        goto fmt_invalid;
                    }

                fmt_invalid:
                    va_end(_cpy);
                    goto format_err;

                fmt_valid:
                    _l = (_p+1)-c;
                    if (_l < sizeof(_format)-2) {
                        memcpy(_format,c,_l);
                        _format[_l] = '\0';
                        newarg = sdscatvprintf(curarg,_format,_cpy);

                        /* Update current position (note: outer blocks
                         * increment c twice so compensate here) */
                        c = _p-1;
                    }

                    va_end(_cpy);
                    break;
                }
            }

            if (newarg == NULL) goto memory_err;
            curarg = newarg;

            touched = 1;
            c++;
        }
        c++;
    }

    /* Add the last argument if needed */
    if (touched) {
        newargv = realloc(curargv,sizeof(char*)*(argc+1));
        if (newargv == NULL) goto memory_err;
        curargv = newargv;
        curargv[argc++] = curarg;
        totlen += bulklen(sdslen(curarg));
    } else {
        sdsfree(curarg);
    }

    /* Clear curarg because it was put in curargv or was free'd. */
    curarg = NULL;

    /* Add bytes needed to hold multi bulk count */
    totlen += 1+countDigits(argc)+2;

    /* Build the command at protocol level */
    cmd = malloc(totlen+1);
    if (cmd == NULL) goto memory_err;

    pos = sprintf(cmd,"*%d\r\n",argc);
    for (j = 0; j < argc; j++) {
        pos += sprintf(cmd+pos,"$%zu\r\n",sdslen(curargv[j]));
        memcpy(cmd+pos,curargv[j],sdslen(curargv[j]));
        pos += sdslen(curargv[j]);
        sdsfree(curargv[j]);
        cmd[pos++] = '\r';
        cmd[pos++] = '\n';
    }
    assert(pos == totlen);
    cmd[pos] = '\0';

    free(curargv);
    *target = cmd;
    return totlen;

format_err:
    error_type = -2;
    goto cleanup;

memory_err:
    error_type = -1;
    goto cleanup;

cleanup:
    if (curargv) {
        while(argc--)
            sdsfree(curargv[argc]);
        free(curargv);
    }

    sdsfree(curarg);
    free(cmd);

    return error_type;
}